

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O3

PErrorDomain p_error_get_domain(PError *error)

{
  PErrorDomain PVar1;
  
  if (error != (PError *)0x0) {
    PVar1 = P_ERROR_DOMAIN_IPC;
    if ((error->code < 600) && (PVar1 = P_ERROR_DOMAIN_NONE, 499 < error->code)) {
      PVar1 = P_ERROR_DOMAIN_IO;
    }
    return PVar1;
  }
  return P_ERROR_DOMAIN_NONE;
}

Assistant:

P_LIB_API PErrorDomain
p_error_get_domain (const PError *error)
{
	if (P_UNLIKELY (error == NULL))
		return P_ERROR_DOMAIN_NONE;

	if (error->code >= (pint) P_ERROR_DOMAIN_IPC)
		return P_ERROR_DOMAIN_IPC;
	else if (error->code >= (pint) P_ERROR_DOMAIN_IO)
		return P_ERROR_DOMAIN_IO;
	else
		return P_ERROR_DOMAIN_NONE;
}